

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O0

void lanli_escape_html(lanli_buffer *ob,uint8_t *data,size_t size)

{
  ulong uVar1;
  bool bVar2;
  size_t mark;
  size_t i;
  size_t size_local;
  uint8_t *data_local;
  lanli_buffer *ob_local;
  
  mark = 0;
  uVar1 = mark;
  while( true ) {
    while( true ) {
      bVar2 = false;
      if (mark < size) {
        bVar2 = ""[data[mark]] == '\0';
      }
      if (!bVar2) break;
      mark = mark + 1;
    }
    if ((uVar1 == 0) && (size <= mark)) break;
    if (uVar1 < mark) {
      lanli_buffer_put(ob,data + uVar1,mark - uVar1);
    }
    if (size <= mark) {
      return;
    }
    lanli_buffer_puts(ob,HTML_ESCAPES[""[data[mark]]]);
    mark = mark + 1;
    uVar1 = mark;
  }
  lanli_buffer_put(ob,data,size);
  return;
}

Assistant:

void lanli_escape_html(lanli_buffer *ob, const uint8_t *data, size_t size) {
  size_t i = 0, mark;

  while (1) {
    mark = i;
    while (i < size && HTML_ESCAPE_TABLE[data[i]] == 0) i++;

    /* Optimization for cases where there's nothing to escape */
    if (mark == 0 && i >= size) {
      lanli_buffer_put(ob, data, size);
      return;
    }

    if (likely(i > mark))
      lanli_buffer_put(ob, data + mark, i - mark);

    if (i >= size) break;

    lanli_buffer_puts(ob, HTML_ESCAPES[HTML_ESCAPE_TABLE[data[i]]]);
    i++;
  }
}